

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_3c4::NinjaMain::EnsureBuildDirExists(NinjaMain *this)

{
  bool bVar1;
  ulong uVar2;
  int *piVar3;
  undefined8 uVar4;
  char *pcVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_59;
  string local_58;
  string local_38;
  NinjaMain *local_18;
  NinjaMain *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"builddir",&local_59);
  BindingEnv::LookupVariable(&local_38,&(this->state_).bindings_,&local_58);
  std::__cxx11::string::operator=((string *)&this->build_dir_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && ((this->config_->dry_run & 1U) == 0)) {
    std::operator+(&local_90,&this->build_dir_,"/.");
    bVar1 = DiskInterface::MakeDirs(&(this->disk_interface_).super_DiskInterface,&local_90);
    bVar6 = false;
    if (!bVar1) {
      piVar3 = __errno_location();
      bVar6 = *piVar3 != 0x11;
    }
    std::__cxx11::string::~string((string *)&local_90);
    if (bVar6) {
      uVar4 = std::__cxx11::string::c_str();
      piVar3 = __errno_location();
      pcVar5 = strerror(*piVar3);
      Error("creating build directory %s: %s",uVar4,pcVar5);
      return false;
    }
  }
  return true;
}

Assistant:

bool NinjaMain::EnsureBuildDirExists() {
  build_dir_ = state_.bindings_.LookupVariable("builddir");
  if (!build_dir_.empty() && !config_.dry_run) {
    if (!disk_interface_.MakeDirs(build_dir_ + "/.") && errno != EEXIST) {
      Error("creating build directory %s: %s",
            build_dir_.c_str(), strerror(errno));
      return false;
    }
  }
  return true;
}